

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O1

void __thiscall OpenMD::LDForceModifier::modifyForces(LDForceModifier *this)

{
  int iVar1;
  MomentData *pMVar2;
  Snapshot *pSVar3;
  double dVar4;
  double dVar5;
  Molecule *pMVar6;
  Molecule *pMVar7;
  uint i_1;
  int iVar8;
  Molecule *this_00;
  long lVar9;
  undefined8 extraout_RAX;
  undefined8 uVar10;
  Mat3x3d *pMVar11;
  ulong uVar12;
  double (*padVar13) [3];
  double *pdVar14;
  pointer ppSVar15;
  uint i_4;
  ulong uVar16;
  uint i_2;
  uint j_1;
  double (*padVar17) [3];
  long lVar18;
  StuntDouble *this_01;
  long lVar19;
  double *pdVar20;
  byte bVar21;
  double tmp;
  double tmp_4;
  double tmp_5;
  double dVar22;
  double tmp_6;
  double dVar23;
  Vector3d molPos;
  Vector<double,_3U> tmp_1;
  Vector3d omegaBody;
  Vector<double,_3U> result_21;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_12;
  Vector<double,_3U> result_11;
  Vector<double,_3U> result_13;
  Vector3d frc;
  Vector3d oldFF;
  Vector3d randomForceBody;
  Vector3d randomTorqueBody;
  Vector3d vcdBody;
  Vector3d Tb;
  MoleculeIterator i;
  Vector3d frictionTorqueLab;
  Vector3d oldFTB;
  Vector3d oldFFL;
  Vector3d frictionForceBody;
  Vector3d vcdLab;
  Mat3x3d Atrans;
  Mat3x3d A;
  uint local_4ac;
  double local_4a8 [10];
  double local_458 [4];
  undefined1 local_438 [16];
  double local_428;
  uint local_418;
  undefined4 local_414;
  double local_410;
  double local_408 [4];
  undefined1 local_3e8 [16];
  double local_3d8;
  double local_398 [4];
  double local_378 [4];
  double local_358 [4];
  double local_338 [4];
  double local_318 [4];
  double local_2f8 [4];
  double local_2d8 [4];
  double local_2b8 [3];
  Molecule *local_2a0;
  pointer local_298;
  ulong local_290;
  double local_288 [4];
  Vector3d local_268;
  double local_248 [4];
  Vector3d local_228;
  double local_208;
  double dStack_200;
  double local_1f8;
  undefined8 uStack_1f0;
  double local_1e8 [4];
  double local_1c8 [4];
  LDForceModifier *local_1a8;
  MoleculeIterator local_1a0;
  double local_198 [4];
  double local_178 [4];
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  double local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar21 = 0;
  uVar12 = 0;
  local_1a0._M_node = (_Base_ptr)0x0;
  local_2f8[2] = 0.0;
  local_2f8[0] = 0.0;
  local_2f8[1] = 0.0;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0.0;
  uStack_70 = 0;
  local_88 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0.0;
  uStack_c0 = 0;
  local_1c8[2] = 0.0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  this_00 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_1a0);
  if (this_00 != (Molecule *)0x0) {
    local_4ac = 0;
    uVar12 = 0;
    local_1a8 = this;
    do {
      if (this->sphericalBoundaryConditions_ == true) {
        Molecule::getCom((Vector3d *)local_4a8,this_00);
        dVar4 = 0.0;
        lVar9 = 0;
        do {
          dVar4 = dVar4 + local_4a8[lVar9] * local_4a8[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
          uVar10 = extraout_RAX;
        }
        else {
          dVar4 = SQRT(dVar4);
          uVar10 = 0;
        }
        local_414 = (undefined4)
                    CONCAT71((int7)((ulong)uVar10 >> 8),this->frozenBufferRadius_ < dVar4);
        local_418 = -(uint)(dVar4 <= this->frozenBufferRadius_ &&
                           this->langevinBufferRadius_ < dVar4);
      }
      else {
        local_418 = (uint)CONCAT71((int7)((ulong)this_00 >> 8),1);
        local_414 = 0;
      }
      ppSVar15 = (this_00->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pMVar7 = this_00;
      pMVar6 = local_2a0;
      if (ppSVar15 ==
          (this_00->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = (StuntDouble *)0x0;
      }
      else {
        this_01 = *ppSVar15;
      }
      while (local_2a0 = pMVar7, this_01 != (StuntDouble *)0x0) {
        if ((char)local_414 != '\0') {
          iVar8 = StuntDouble::freeze(this_01);
          uVar12 = (ulong)(uint)((int)uVar12 + iVar8);
          this = local_1a8;
        }
        if ((local_418 & 1) != 0) {
          local_410 = this_01->mass_;
          local_298 = ppSVar15;
          local_290 = uVar12;
          if (this_01->objType_ - otDAtom < 2) {
            StuntDouble::getA((RotMat3x3d *)local_4a8,this_01);
            pdVar14 = &local_78;
            padVar13 = (double (*) [3])local_4a8;
            pdVar20 = pdVar14;
            for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
              *pdVar20 = (((RotMat3x3d *)padVar13)->super_SquareMatrix<double,_3>).
                         super_RectMatrix<double,_3U,_3U>.data_[0][0];
              padVar13 = (double (*) [3])((long)padVar13 + ((ulong)bVar21 * -2 + 1) * 8);
              pdVar20 = pdVar20 + (ulong)bVar21 * -2 + 1;
            }
            local_4a8[6] = 0.0;
            local_4a8[7] = 0.0;
            local_4a8[4] = 0.0;
            local_4a8[5] = 0.0;
            local_4a8[2] = 0.0;
            local_4a8[3] = 0.0;
            local_4a8[0] = 0.0;
            local_4a8[1] = 0.0;
            local_4a8[8] = 0.0;
            lVar9 = 0;
            padVar13 = (double (*) [3])local_4a8;
            do {
              lVar19 = 0;
              padVar17 = padVar13;
              do {
                (((SquareMatrix<double,_3> *)*padVar17)->super_RectMatrix<double,_3U,_3U>).data_[0]
                [0] = pdVar14[lVar19];
                lVar19 = lVar19 + 1;
                padVar17 = padVar17 + 1;
              } while (lVar19 != 3);
              lVar9 = lVar9 + 1;
              padVar13 = (double (*) [3])(*padVar13 + 1);
              pdVar14 = pdVar14 + 3;
            } while (lVar9 != 3);
            pdVar14 = &local_c8;
            padVar13 = (double (*) [3])local_4a8;
            pdVar20 = pdVar14;
            for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
              *pdVar20 = (*padVar13)[0];
              padVar13 = (double (*) [3])((long)padVar13 + ((ulong)bVar21 * -2 + 1) * 8);
              pdVar20 = pdVar20 + (ulong)bVar21 * -2 + 1;
            }
            pMVar2 = (this->moments_).
                     super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_4ac];
            local_4a8[0] = 0.0;
            local_4a8[1] = 0.0;
            local_4a8[2] = 0.0;
            lVar9 = 0;
            do {
              dVar4 = local_4a8[lVar9];
              lVar19 = 0;
              do {
                dVar4 = dVar4 + pdVar14[lVar19] *
                                *(double *)
                                 ((long)(pMVar2->rcr).super_Vector<double,_3U>.data_ + lVar19 * 8);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_4a8[lVar9] = dVar4;
              lVar9 = lVar9 + 1;
              pdVar14 = pdVar14 + 3;
            } while (lVar9 != 3);
            local_1f8 = local_4a8[0];
            uStack_1f0 = 0;
            local_208 = local_4a8[1];
            dStack_200 = local_4a8[2];
            local_268.super_Vector<double,_3U>.data_[2] = 0.0;
            local_268.super_Vector<double,_3U>.data_[0] = 0.0;
            local_268.super_Vector<double,_3U>.data_[1] = 0.0;
            local_228.super_Vector<double,_3U>.data_[2] = 0.0;
            local_228.super_Vector<double,_3U>.data_[0] = 0.0;
            local_228.super_Vector<double,_3U>.data_[1] = 0.0;
            genRandomForceAndTorque(this,&local_268,&local_228,local_4ac);
            local_4a8[0] = 0.0;
            local_4a8[1] = 0.0;
            local_4a8[2] = 0.0;
            pdVar14 = &local_c8;
            lVar9 = 0;
            do {
              dVar4 = local_4a8[lVar9];
              lVar19 = 0;
              do {
                dVar4 = dVar4 + pdVar14[lVar19] * local_268.super_Vector<double,_3U>.data_[lVar19];
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_4a8[lVar9] = dVar4;
              dVar22 = local_4a8[2];
              dVar5 = local_4a8[1];
              dVar4 = local_4a8[0];
              lVar9 = lVar9 + 1;
              pdVar14 = pdVar14 + 3;
            } while (lVar9 != 3);
            local_2b8[2] = local_4a8[2];
            local_2b8[0] = local_4a8[0];
            local_2b8[1] = local_4a8[1];
            local_4a8[0] = 0.0;
            local_4a8[1] = 0.0;
            local_4a8[2] = 0.0;
            pdVar14 = &local_c8;
            lVar9 = 0;
            do {
              dVar23 = local_4a8[lVar9];
              lVar19 = 0;
              do {
                dVar23 = dVar23 + pdVar14[lVar19] * local_228.super_Vector<double,_3U>.data_[lVar19]
                ;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              local_4a8[lVar9] = dVar23;
              lVar9 = lVar9 + 1;
              pdVar14 = pdVar14 + 3;
            } while (lVar9 != 3);
            local_288[2] = local_4a8[2];
            local_288[0] = local_4a8[0];
            local_288[1] = local_4a8[1];
            lVar9 = (long)this_01->localIndex_ * 0x18 +
                    *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).force.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            lVar19 = 0;
            do {
              *(double *)(lVar9 + lVar19 * 8) = local_2b8[lVar19] + *(double *)(lVar9 + lVar19 * 8);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_d8 = dStack_200;
            dStack_d0 = local_1f8;
            dVar23 = dVar4 * dStack_200 - dVar22 * local_1f8;
            local_438._8_4_ = SUB84(dVar23,0);
            local_438._0_8_ = dVar22 * local_208 - dVar5 * dStack_200;
            local_438._12_4_ = (int)((ulong)dVar23 >> 0x20);
            local_428 = local_1f8 * dVar5 - dVar4 * local_208;
            local_3e8 = ZEXT816(0);
            local_3d8 = 0.0;
            lVar9 = 0;
            do {
              *(double *)(local_3e8 + lVar9 * 8) =
                   local_288[lVar9] + *(double *)(local_438 + lVar9 * 8);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_4a8[2] = local_3d8;
            local_4a8[0] = (double)local_3e8._0_8_;
            local_4a8[1] = (double)local_3e8._8_8_;
            pSVar3 = this_01->snapshotMan_->currentSnapshot_;
            lVar9 = (long)this_01->localIndex_;
            lVar19 = lVar9 * 0x18 +
                     *(long *)((long)&(pSVar3->atomData).torque.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + this_01->storage_)
            ;
            lVar18 = 0;
            do {
              *(double *)(lVar19 + lVar18 * 8) =
                   local_4a8[lVar18] + *(double *)(lVar19 + lVar18 * 8);
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            local_428 = 0.0;
            local_438 = ZEXT816(0);
            lVar19 = *(long *)((long)&(pSVar3->atomData).velocity.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + this_01->storage_)
            ;
            local_2d8[2] = *(double *)(lVar19 + 0x10 + lVar9 * 0x18);
            pdVar14 = (double *)(lVar19 + lVar9 * 0x18);
            local_2d8[0] = *pdVar14;
            local_2d8[1] = pdVar14[1];
            pSVar3 = this_01->snapshotMan_->currentSnapshot_;
            lVar9 = *(long *)((long)&(pSVar3->atomData).angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            lVar19 = (long)this_01->localIndex_ * 0x18;
            local_408[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar19);
            pdVar14 = (double *)(lVar9 + lVar19);
            local_408[0] = *pdVar14;
            local_408[1] = pdVar14[1];
            lVar9 = *(long *)((long)&(pSVar3->atomData).force.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            local_2f8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar19);
            pdVar14 = (double *)(lVar9 + lVar19);
            local_2f8[0] = *pdVar14;
            local_2f8[1] = pdVar14[1];
            dVar4 = this->dt2_;
            local_3d8 = 0.0;
            local_3e8 = ZEXT816(0);
            lVar9 = 0;
            do {
              *(double *)(local_3e8 + lVar9 * 8) =
                   local_2f8[lVar9] * (dVar4 / local_410) * 0.0004184;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_4a8[0] = 0.0;
            local_4a8[1] = 0.0;
            local_4a8[2] = 0.0;
            lVar9 = 0;
            do {
              local_4a8[lVar9] = local_2d8[lVar9] + *(double *)(local_3e8 + lVar9 * 8);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_f8[2] = local_4a8[2];
            local_f8[0] = local_4a8[0];
            local_f8[1] = local_4a8[1];
            pMVar11 = (Mat3x3d *)
                      ((long)this_01->localIndex_ * 0x18 +
                      *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).torque.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + this_01->storage_
                               ));
            local_3e8 = ZEXT816(0);
            local_3d8 = 0.0;
            if (pMVar11 != (Mat3x3d *)local_3e8) {
              lVar9 = 0;
              do {
                *(double *)(local_3e8 + lVar9 * 8) =
                     (pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     [0][lVar9];
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
            }
            StuntDouble::lab2Body((Vector3d *)local_4a8,this_01,(Vector3d *)local_3e8);
            local_1c8[2] = local_4a8[2];
            local_1c8[0] = local_4a8[0];
            local_1c8[1] = local_4a8[1];
            dVar4 = this->dt2_;
            local_3e8 = ZEXT816(0);
            local_3d8 = 0.0;
            lVar9 = 0;
            do {
              *(double *)(local_3e8 + lVar9 * 8) = local_1c8[lVar9] * dVar4 * 0.0004184;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_4a8[0] = 0.0;
            local_4a8[1] = 0.0;
            local_4a8[2] = 0.0;
            lVar9 = 0;
            do {
              local_4a8[lVar9] = local_408[lVar9] + *(double *)(local_3e8 + lVar9 * 8);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_248[2] = local_4a8[2];
            local_248[0] = local_4a8[0];
            local_248[1] = local_4a8[1];
            local_118[2] = 0.0;
            local_118[0] = 0.0;
            local_118[1] = 0.0;
            local_1e8[2] = 0.0;
            local_1e8[0] = 0.0;
            local_1e8[1] = 0.0;
            local_138[2] = 0.0;
            local_138[0] = 0.0;
            local_138[1] = 0.0;
            local_398[2] = 0.0;
            local_398[0] = 0.0;
            local_398[1] = 0.0;
            local_158[2] = 0.0;
            local_158[0] = 0.0;
            local_158[1] = 0.0;
            local_318[2] = 0.0;
            local_318[0] = 0.0;
            local_318[1] = 0.0;
            local_178[2] = 0.0;
            local_178[0] = 0.0;
            local_178[1] = 0.0;
            local_198[2] = 0.0;
            local_198[0] = 0.0;
            local_198[1] = 0.0;
            if (0 < this->maxIterNum_) {
              iVar8 = 0;
              do {
                if (this_01->linear_ == true) {
                  iVar1 = this_01->linearAxis_;
                  uVar16 = (ulong)(((iVar1 + 1) / 3) * -3 + iVar1 + 1);
                  pMVar2 = (this->moments_).
                           super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_4ac];
                  uVar12 = (ulong)(iVar1 + ((iVar1 + 2) / 3) * -3 + 2);
                  *(double *)(local_438 + uVar16 * 8) =
                       local_248[uVar16] /
                       *(double *)
                        ((long)&(pMVar2->Icr).super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U> + uVar16 * 0x20);
                  *(double *)(local_438 + uVar12 * 8) =
                       local_248[uVar12] /
                       *(double *)
                        ((long)&(pMVar2->Icr).super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U> + uVar12 * 0x20);
                }
                else {
                  pMVar11 = &(this->moments_).
                             super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_4ac]->IcrInv;
                  local_4a8[0] = 0.0;
                  local_4a8[1] = 0.0;
                  local_4a8[2] = 0.0;
                  lVar9 = 0;
                  do {
                    dVar4 = local_4a8[lVar9];
                    lVar19 = 0;
                    do {
                      dVar4 = dVar4 + *(double *)
                                       ((long)(pMVar11->super_SquareMatrix<double,_3>).
                                              super_RectMatrix<double,_3U,_3U>.data_ + lVar19 * 8) *
                                      local_248[lVar19];
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 3);
                    local_4a8[lVar9] = dVar4;
                    lVar9 = lVar9 + 1;
                    pMVar11 = (Mat3x3d *)
                              ((long)(pMVar11->super_SquareMatrix<double,_3>).
                                     super_RectMatrix<double,_3U,_3U>.data_ + 0x18);
                  } while (lVar9 != 3);
                  local_428 = local_4a8[2];
                  local_438._8_8_ = local_4a8[1];
                  local_438._0_8_ = local_4a8[0];
                }
                local_4a8[0] = 0.0;
                local_4a8[1] = 0.0;
                local_4a8[2] = 0.0;
                pdVar14 = &local_c8;
                lVar9 = 0;
                do {
                  dVar4 = local_4a8[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + pdVar14[lVar19] * *(double *)(local_438 + lVar19 * 8);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_4a8[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  pdVar14 = pdVar14 + 3;
                } while (lVar9 != 3);
                dVar4 = local_4a8[2] * dStack_d0 - local_4a8[0] * dStack_200;
                local_3e8._8_4_ = SUB84(dVar4,0);
                local_3e8._0_8_ = local_4a8[1] * local_d8 - local_4a8[2] * local_208;
                local_3e8._12_4_ = (int)((ulong)dVar4 >> 0x20);
                local_3d8 = local_4a8[0] * local_208 - local_1f8 * local_4a8[1];
                local_4a8[0] = 0.0;
                local_4a8[1] = 0.0;
                local_4a8[2] = 0.0;
                lVar9 = 0;
                do {
                  local_4a8[lVar9] = local_f8[lVar9] + *(double *)(local_3e8 + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_118[2] = local_4a8[2];
                local_118[0] = local_4a8[0];
                local_118[1] = local_4a8[1];
                local_4a8[0] = 0.0;
                local_4a8[1] = 0.0;
                local_4a8[2] = 0.0;
                pdVar14 = &local_78;
                lVar9 = 0;
                do {
                  dVar4 = local_4a8[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + pdVar14[lVar19] * local_118[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_4a8[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  pdVar14 = pdVar14 + 3;
                } while (lVar9 != 3);
                local_1e8[2] = local_4a8[2];
                local_1e8[0] = local_4a8[0];
                local_1e8[1] = local_4a8[1];
                HydroProp::getXitt((Mat3x3d *)local_4a8,
                                   (this->hydroProps_).
                                   super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_4ac]);
                local_358[0] = 0.0;
                local_358[1] = 0.0;
                local_358[2] = 0.0;
                lVar9 = 0;
                padVar13 = (double (*) [3])local_4a8;
                do {
                  dVar4 = local_358[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + (*padVar13)[lVar19] * local_1e8[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_358[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  padVar13 = padVar13 + 1;
                } while (lVar9 != 3);
                HydroProp::getXirt((Mat3x3d *)local_3e8,
                                   (this->hydroProps_).
                                   super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_4ac]);
                local_378[0] = 0.0;
                local_378[1] = 0.0;
                local_378[2] = 0.0;
                lVar9 = 0;
                padVar13 = (double (*) [3])local_3e8;
                do {
                  dVar4 = local_378[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + (((SquareMatrix<double,_3> *)*padVar13)->
                                    super_RectMatrix<double,_3U,_3U>).data_[0][lVar19] *
                                    *(double *)(local_438 + lVar19 * 8);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_378[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  padVar13 = padVar13 + 1;
                } while (lVar9 != 3);
                local_338[0] = 0.0;
                local_338[1] = 0.0;
                local_338[2] = 0.0;
                lVar9 = 0;
                do {
                  local_338[lVar9] = local_358[lVar9] + local_378[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_458[2] = local_338[2];
                local_458[0] = local_338[0];
                local_458[1] = local_338[1];
                lVar9 = 0;
                do {
                  local_458[lVar9] = -local_458[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_138[2] = local_458[2];
                local_138[0] = local_458[0];
                local_138[1] = local_458[1];
                local_158[0] = local_398[0];
                local_158[1] = local_398[1];
                local_158[2] = local_398[2];
                local_4a8[0] = 0.0;
                local_4a8[1] = 0.0;
                local_4a8[2] = 0.0;
                pdVar14 = &local_c8;
                lVar9 = 0;
                do {
                  dVar4 = local_4a8[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + pdVar14[lVar19] * local_138[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_4a8[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  pdVar14 = pdVar14 + 3;
                } while (lVar9 != 3);
                local_398[2] = local_4a8[2];
                local_398[0] = local_4a8[0];
                local_398[1] = local_4a8[1];
                local_178[0] = local_318[0];
                local_178[1] = local_318[1];
                local_178[2] = local_318[2];
                HydroProp::getXitr((Mat3x3d *)local_4a8,
                                   (this->hydroProps_).
                                   super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_4ac]);
                local_358[0] = 0.0;
                local_358[1] = 0.0;
                local_358[2] = 0.0;
                lVar9 = 0;
                padVar13 = (double (*) [3])local_4a8;
                do {
                  dVar4 = local_358[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + (*padVar13)[lVar19] * local_1e8[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_358[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  padVar13 = padVar13 + 1;
                } while (lVar9 != 3);
                HydroProp::getXirr((Mat3x3d *)local_3e8,
                                   (this->hydroProps_).
                                   super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_4ac]);
                local_378[0] = 0.0;
                local_378[1] = 0.0;
                local_378[2] = 0.0;
                lVar9 = 0;
                padVar13 = (double (*) [3])local_3e8;
                do {
                  dVar4 = local_378[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + (*padVar13)[lVar19] * *(double *)(local_438 + lVar19 * 8);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_378[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  padVar13 = padVar13 + 1;
                } while (lVar9 != 3);
                local_338[0] = 0.0;
                local_338[1] = 0.0;
                local_338[2] = 0.0;
                lVar9 = 0;
                do {
                  local_338[lVar9] = local_358[lVar9] + local_378[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_458[2] = local_338[2];
                local_458[0] = local_338[0];
                local_458[1] = local_338[1];
                lVar9 = 0;
                do {
                  local_458[lVar9] = -local_458[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_318[2] = local_458[2];
                local_318[0] = local_458[0];
                local_318[1] = local_458[1];
                local_4a8[0] = 0.0;
                local_4a8[1] = 0.0;
                local_4a8[2] = 0.0;
                pdVar14 = &local_c8;
                lVar9 = 0;
                do {
                  dVar4 = local_4a8[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + pdVar14[lVar19] * local_318[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_4a8[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  pdVar14 = pdVar14 + 3;
                } while (lVar9 != 3);
                local_198[2] = local_4a8[2];
                local_198[0] = local_4a8[0];
                local_198[1] = local_4a8[1];
                dVar4 = this->dt2_;
                local_458[0] = 0.0;
                local_458[1] = 0.0;
                local_458[2] = 0.0;
                lVar9 = 0;
                do {
                  local_458[lVar9] = local_2f8[lVar9] + local_398[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_3e8 = ZEXT816(0);
                local_3d8 = 0.0;
                lVar9 = 0;
                do {
                  *(double *)(local_3e8 + lVar9 * 8) =
                       local_458[lVar9] * (dVar4 / local_410) * 0.0004184;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_4a8[0] = 0.0;
                local_4a8[1] = 0.0;
                local_4a8[2] = 0.0;
                lVar9 = 0;
                do {
                  local_4a8[lVar9] = local_2d8[lVar9] + *(double *)(local_3e8 + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_f8[2] = local_4a8[2];
                local_f8[0] = local_4a8[0];
                local_f8[1] = local_4a8[1];
                local_458[0] = 0.0;
                local_458[1] = 0.0;
                local_458[2] = 0.0;
                lVar9 = 0;
                do {
                  local_458[lVar9] = local_1c8[lVar9] + local_318[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_3e8 = ZEXT816(0);
                local_3d8 = 0.0;
                lVar9 = 0;
                do {
                  *(double *)(local_3e8 + lVar9 * 8) = local_458[lVar9] * dVar4 * 0.0004184;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_4a8[0] = 0.0;
                local_4a8[1] = 0.0;
                local_4a8[2] = 0.0;
                lVar9 = 0;
                do {
                  local_4a8[lVar9] = local_408[lVar9] + *(double *)(local_3e8 + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_248[2] = local_4a8[2];
                local_248[0] = local_4a8[0];
                local_248[1] = local_4a8[1];
                dVar4 = 0.0;
                lVar9 = 0;
                do {
                  dVar4 = dVar4 + local_398[lVar9] * local_158[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                dVar5 = 0.0;
                lVar9 = 0;
                do {
                  dVar5 = dVar5 + local_398[lVar9] * local_398[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                dVar22 = 0.0;
                lVar9 = 0;
                do {
                  dVar22 = dVar22 + local_318[lVar9] * local_178[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                dVar23 = 0.0;
                lVar9 = 0;
                do {
                  dVar23 = dVar23 + local_318[lVar9] * local_318[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
              } while (((this->forceTolerance_ < ABS(1.0 - dVar4 / dVar5)) ||
                       (this->forceTolerance_ < ABS(1.0 - dVar22 / dVar23))) &&
                      (iVar8 = iVar8 + 1, iVar8 < this->maxIterNum_));
            }
            lVar9 = (long)this_01->localIndex_ * 0x18 +
                    *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).force.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            lVar19 = 0;
            do {
              *(double *)(lVar9 + lVar19 * 8) = local_398[lVar19] + *(double *)(lVar9 + lVar19 * 8);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            local_458[0] = local_208 * local_398[2] - local_d8 * local_398[1];
            local_458[1] = dStack_200 * local_398[0] - dStack_d0 * local_398[2];
            local_458[2] = local_1f8 * local_398[1] - local_208 * local_398[0];
            local_3e8 = ZEXT816(0);
            local_3d8 = 0.0;
            lVar9 = 0;
            do {
              *(double *)(local_3e8 + lVar9 * 8) = local_198[lVar9] + local_458[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_4a8[2] = local_3d8;
            local_4a8[0] = (double)local_3e8._0_8_;
            local_4a8[1] = (double)local_3e8._8_8_;
            lVar9 = (long)this_01->localIndex_ * 0x18 +
                    *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).torque.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            lVar19 = 0;
            do {
              *(double *)(lVar9 + lVar19 * 8) = local_4a8[lVar19] + *(double *)(lVar9 + lVar19 * 8);
              lVar19 = lVar19 + 1;
              ppSVar15 = local_298;
              uVar12 = local_290;
              this_00 = local_2a0;
            } while (lVar19 != 3);
          }
          else {
            local_268.super_Vector<double,_3U>.data_[0] = 0.0;
            local_268.super_Vector<double,_3U>.data_[1] = 0.0;
            local_268.super_Vector<double,_3U>.data_[2] = 0.0;
            local_228.super_Vector<double,_3U>.data_[2] = 0.0;
            local_228.super_Vector<double,_3U>.data_[0] = 0.0;
            local_228.super_Vector<double,_3U>.data_[1] = 0.0;
            genRandomForceAndTorque(this,&local_268,&local_228,local_4ac);
            lVar9 = (long)this_01->localIndex_ * 0x18 +
                    *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).force.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            lVar19 = 0;
            do {
              *(double *)(lVar9 + lVar19 * 8) =
                   local_268.super_Vector<double,_3U>.data_[lVar19] +
                   *(double *)(lVar9 + lVar19 * 8);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            pSVar3 = this_01->snapshotMan_->currentSnapshot_;
            lVar9 = *(long *)((long)&(pSVar3->atomData).velocity.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            lVar19 = (long)this_01->localIndex_ * 0x18;
            local_2b8[2] = *(double *)(lVar9 + 0x10 + lVar19);
            pdVar14 = (double *)(lVar9 + lVar19);
            local_2b8[0] = *pdVar14;
            local_2b8[1] = pdVar14[1];
            lVar9 = *(long *)((long)&(pSVar3->atomData).force.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            local_2f8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar19);
            pdVar14 = (double *)(lVar9 + lVar19);
            local_2f8[0] = *pdVar14;
            local_2f8[1] = pdVar14[1];
            dVar4 = this->dt2_;
            local_3e8 = ZEXT816(0);
            local_3d8 = 0.0;
            lVar9 = 0;
            do {
              *(double *)(local_3e8 + lVar9 * 8) =
                   local_2f8[lVar9] * (dVar4 / local_410) * 0.0004184;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_4a8[0] = 0.0;
            local_4a8[1] = 0.0;
            local_4a8[2] = 0.0;
            lVar9 = 0;
            do {
              local_4a8[lVar9] = local_2b8[lVar9] + *(double *)(local_3e8 + lVar9 * 8);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_288[2] = local_4a8[2];
            local_288[0] = local_4a8[0];
            local_288[1] = local_4a8[1];
            local_428 = 0.0;
            local_438 = ZEXT816(0);
            local_2d8[2] = 0.0;
            local_2d8[0] = 0.0;
            local_2d8[1] = 0.0;
            if (0 < this->maxIterNum_) {
              iVar8 = 0;
              do {
                local_2d8[2] = local_428;
                local_2d8[0] = (double)local_438._0_8_;
                local_2d8[1] = (double)local_438._8_8_;
                local_288[0] = local_4a8[0];
                local_288[1] = local_4a8[1];
                local_288[2] = local_4a8[2];
                HydroProp::getXitt((Mat3x3d *)local_3e8,
                                   (this->hydroProps_).
                                   super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_4ac]);
                padVar13 = (double (*) [3])local_3e8;
                padVar17 = (double (*) [3])local_4a8;
                for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (*padVar17)[0] = (*padVar13)[0];
                  padVar13 = (double (*) [3])((long)padVar13 + (ulong)bVar21 * -0x10 + 8);
                  padVar17 = (double (*) [3])((long)padVar17 + ((ulong)bVar21 * -2 + 1) * 8);
                }
                lVar9 = 0;
                padVar13 = (double (*) [3])local_4a8;
                do {
                  lVar19 = 0;
                  do {
                    (*padVar13)[lVar19] = -(*padVar13)[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  lVar9 = lVar9 + 1;
                  padVar13 = padVar13 + 1;
                } while (lVar9 != 3);
                local_408[0] = 0.0;
                local_408[1] = 0.0;
                local_408[2] = 0.0;
                lVar9 = 0;
                padVar13 = (double (*) [3])local_4a8;
                do {
                  dVar4 = local_408[lVar9];
                  lVar19 = 0;
                  do {
                    dVar4 = dVar4 + (*padVar13)[lVar19] * local_288[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 3);
                  local_408[lVar9] = dVar4;
                  lVar9 = lVar9 + 1;
                  padVar13 = padVar13 + 1;
                } while (lVar9 != 3);
                local_428 = local_408[2];
                local_438._8_8_ = local_408[1];
                local_438._0_8_ = local_408[0];
                dVar4 = this->dt2_;
                local_408[0] = 0.0;
                local_408[1] = 0.0;
                local_408[2] = 0.0;
                lVar9 = 0;
                do {
                  local_408[lVar9] = local_2f8[lVar9] + *(double *)(local_438 + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_3e8 = ZEXT816(0);
                local_3d8 = 0.0;
                lVar9 = 0;
                do {
                  *(double *)(local_3e8 + lVar9 * 8) =
                       local_408[lVar9] * (dVar4 / local_410) * 0.0004184;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_4a8[0] = 0.0;
                local_4a8[1] = 0.0;
                local_4a8[2] = 0.0;
                lVar9 = 0;
                do {
                  local_4a8[lVar9] = local_2b8[lVar9] + *(double *)(local_3e8 + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                local_288[2] = local_4a8[2];
                local_288[0] = local_4a8[0];
                local_288[1] = local_4a8[1];
                dVar4 = 0.0;
                lVar9 = 0;
                do {
                  dVar4 = dVar4 + *(double *)(local_438 + lVar9 * 8) * local_2d8[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
                dVar5 = 0.0;
                lVar9 = 0;
                do {
                  dVar5 = dVar5 + *(double *)(local_438 + lVar9 * 8) *
                                  *(double *)(local_438 + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 3);
              } while ((this->forceTolerance_ < ABS(1.0 - dVar4 / dVar5)) &&
                      (iVar8 = iVar8 + 1, iVar8 < this->maxIterNum_));
            }
            lVar9 = (long)this_01->localIndex_ * 0x18 +
                    *(long *)((long)&(this_01->snapshotMan_->currentSnapshot_->atomData).force.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_01->storage_);
            lVar19 = 0;
            do {
              *(double *)(lVar9 + lVar19 * 8) =
                   *(double *)(local_438 + lVar19 * 8) + *(double *)(lVar9 + lVar19 * 8);
              lVar19 = lVar19 + 1;
              ppSVar15 = local_298;
              uVar12 = local_290;
              this_00 = local_2a0;
              local_4a8[0] = local_288[0];
              local_4a8[1] = local_288[1];
              local_4a8[2] = local_288[2];
            } while (lVar19 != 3);
          }
        }
        ppSVar15 = ppSVar15 + 1;
        if (ppSVar15 ==
            (this_00->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_01 = (StuntDouble *)0x0;
        }
        else {
          this_01 = *ppSVar15;
        }
        local_4ac = local_4ac + 1;
        pMVar7 = local_2a0;
        pMVar6 = local_2a0;
      }
      local_2a0 = pMVar6;
      this_00 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_1a0);
    } while (this_00 != (Molecule *)0x0);
  }
  ((this->super_ForceModifier).info_)->fdf_local = (int)uVar12;
  if ((this->simParams_->ConserveLinearMomentum).super_ParameterBase.field_0x2b == '\x01') {
    Velocitizer::removeComDrift
              ((this->veloMunge_)._M_t.
               super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
               .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl);
  }
  if (((this->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') &&
     ((this->simParams_->ConserveAngularMomentum).super_ParameterBase.field_0x2b == '\x01')) {
    Velocitizer::removeAngularDrift
              ((this->veloMunge_)._M_t.
               super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
               .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void LDForceModifier::modifyForces() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    RealType mass;
    Vector3d pos;
    Vector3d frc;
    Mat3x3d A;
    Mat3x3d Atrans;
    Vector3d Tb;
    Vector3d ji;
    unsigned int index = 0;
    bool doLangevinForces;
    bool freezeMolecule;
    int fdf;

    fdf = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      doLangevinForces = true;
      freezeMolecule   = false;

      if (sphericalBoundaryConditions_) {
        Vector3d molPos = mol->getCom();
        RealType molRad = molPos.length();

        doLangevinForces = false;

        if (molRad > langevinBufferRadius_) {
          doLangevinForces = true;
          freezeMolecule   = false;
        }
        if (molRad > frozenBufferRadius_) {
          doLangevinForces = false;
          freezeMolecule   = true;
        }
      }

      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        if (freezeMolecule) fdf += sd->freeze();

        if (doLangevinForces) {
          mass = sd->getMass();
          if (sd->isDirectional()) {
            // preliminaries for directional objects:

            A      = sd->getA();
            Atrans = A.transpose();

            Vector3d rcrLab = Atrans * moments_[index]->rcr;

            // apply random force and torque at center of resistance

            Vector3d randomForceBody;
            Vector3d randomTorqueBody;
            genRandomForceAndTorque(randomForceBody, randomTorqueBody, index);
            Vector3d randomForceLab  = Atrans * randomForceBody;
            Vector3d randomTorqueLab = Atrans * randomTorqueBody;

            sd->addFrc(randomForceLab);
            sd->addTrq(randomTorqueLab + cross(rcrLab, randomForceLab));

            Vector3d omegaBody;

            // What remains contains velocity explicitly, but the
            // velocity required is at the full step: v(t + h), while
            // we have initially the velocity at the half step: v(t + h/2).
            // We need to iterate to converge the friction
            // force and friction torque vectors.

            // this is the velocity at the half-step:

            Vector3d vel    = sd->getVel();
            Vector3d angMom = sd->getJ();

            // estimate velocity at full-step using everything but
            // friction forces:

            frc = sd->getFrc();

            Vector3d velStep =
                vel + (dt2_ / mass * Constants::energyConvert) * frc;

            Tb = sd->lab2Body(sd->getTrq());
            Vector3d angMomStep =
                angMom + (dt2_ * Constants::energyConvert) * Tb;

            Vector3d omegaLab;
            Vector3d vcdLab;
            Vector3d vcdBody;
            Vector3d frictionForceBody;
            Vector3d frictionForceLab(0.0);
            Vector3d oldFFL;  // used to test for convergence
            Vector3d frictionTorqueBody(0.0);
            Vector3d oldFTB;  // used to test for convergence
            Vector3d frictionTorqueLab;
            RealType fdot;
            RealType tdot;

            // iteration starts here:

            for (int k = 0; k < maxIterNum_; k++) {
              if (sd->isLinear()) {
                int linearAxis = sd->linearAxis();
                int l          = (linearAxis + 1) % 3;
                int m          = (linearAxis + 2) % 3;
                omegaBody[l]   = angMomStep[l] / moments_[index]->Icr(l, l);
                omegaBody[m]   = angMomStep[m] / moments_[index]->Icr(m, m);

              } else {
                omegaBody = moments_[index]->IcrInv * angMomStep;
                // omegaBody[0] = angMomStep[0] /I(0, 0);
                // omegaBody[1] = angMomStep[1] /I(1, 1);
                // omegaBody[2] = angMomStep[2] /I(2, 2);
              }

              omegaLab = Atrans * omegaBody;

              // apply friction force and torque at center of resistance

              vcdLab             = velStep + cross(omegaLab, rcrLab);
              vcdBody            = A * vcdLab;
              frictionForceBody  = -(hydroProps_[index]->getXitt() * vcdBody +
                                    hydroProps_[index]->getXirt() * omegaBody);
              oldFFL             = frictionForceLab;
              frictionForceLab   = Atrans * frictionForceBody;
              oldFTB             = frictionTorqueBody;
              frictionTorqueBody = -(hydroProps_[index]->getXitr() * vcdBody +
                                     hydroProps_[index]->getXirr() * omegaBody);
              frictionTorqueLab  = Atrans * frictionTorqueBody;

              // re-estimate velocities at full-step using friction forces:

              velStep = vel + (dt2_ / mass * Constants::energyConvert) *
                                  (frc + frictionForceLab);
              angMomStep = angMom + (dt2_ * Constants::energyConvert) *
                                        (Tb + frictionTorqueBody);

              // check for convergence (if the vectors have converged, fdot and
              // tdot will both be 1.0):

              fdot = dot(frictionForceLab, oldFFL) /
                     frictionForceLab.lengthSquare();
              tdot = dot(frictionTorqueBody, oldFTB) /
                     frictionTorqueBody.lengthSquare();

              if (fabs(1.0 - fdot) <= forceTolerance_ &&
                  fabs(1.0 - tdot) <= forceTolerance_)
                break;  // iteration ends here
            }

            sd->addFrc(frictionForceLab);
            sd->addTrq(frictionTorqueLab + cross(rcrLab, frictionForceLab));

          } else {
            // spherical atom

            Vector3d systemForce;
            Vector3d randomForce;
            Vector3d randomTorque;
            genRandomForceAndTorque(randomForce, randomTorque, index);
            systemForce = sd->getFrc();
            sd->addFrc(randomForce);

            // What remains contains velocity explicitly, but the
            // velocity required is at the full step: v(t + h), while
            // we have initially the velocity at the half step: v(t + h/2).
            // We need to iterate to converge the friction
            // force vector.

            // this is the velocity at the half-step:

            Vector3d vel = sd->getVel();

            // estimate velocity at full-step using everything but
            // friction forces:

            frc = sd->getFrc();
            Vector3d velStep =
                vel + (dt2_ / mass * Constants::energyConvert) * frc;

            Vector3d frictionForce(0.0);
            Vector3d oldFF;  // used to test for convergence
            RealType fdot;

            // iteration starts here:

            for (int k = 0; k < maxIterNum_; k++) {
              oldFF         = frictionForce;
              frictionForce = -hydroProps_[index]->getXitt() * velStep;

              // re-estimate velocities at full-step using friction forces:

              velStep = vel + (dt2_ / mass * Constants::energyConvert) *
                                  (frc + frictionForce);

              // check for convergence (if the vector has converged,
              // fdot will be 1.0):

              fdot = dot(frictionForce, oldFF) / frictionForce.lengthSquare();

              if (fabs(1.0 - fdot) <= forceTolerance_)
                break;  // iteration ends here
            }

            sd->addFrc(frictionForce);
          }
        }

        ++index;
      }
    }

    info_->setFdf(fdf);
    if (simParams_->getConserveLinearMomentum()) veloMunge_->removeComDrift();
    // Remove angular drift if we are not using periodic boundary conditions.
    if (!simParams_->getUsePeriodicBoundaryConditions() &&
        simParams_->getConserveAngularMomentum())
      veloMunge_->removeAngularDrift();
  }